

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O2

uint8_t * __thiscall
icu_63::BMPSet::spanUTF8(BMPSet *this,uint8_t *s,int32_t length,USetSpanCondition spanCondition)

{
  char cVar1;
  UBool UVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  
  pbVar12 = s + length;
  bVar6 = *s;
  if (-1 < (char)bVar6) {
    lVar4 = (long)length + -1;
    if (spanCondition == USET_SPAN_NOT_CONTAINED) {
      do {
        if (this->latin1Contains[bVar6] != '\0') {
          return s;
        }
        if (lVar4 == 0) {
          return pbVar12;
        }
        s = s + 1;
        bVar6 = *s;
        lVar4 = lVar4 + -1;
      } while (-1 < (char)bVar6);
    }
    else {
      do {
        if (this->latin1Contains[bVar6] == '\0') {
          return s;
        }
        if (lVar4 == 0) {
          return pbVar12;
        }
        s = s + 1;
        bVar6 = *s;
        lVar4 = lVar4 + -1;
      } while (-1 < (char)bVar6);
    }
    length = (int)pbVar12 - (int)s;
  }
  uVar8 = (uint)(spanCondition != USET_SPAN_NOT_CONTAINED);
  pbVar11 = pbVar12;
  if ((char)pbVar12[-1] < '\0') {
    if (pbVar12[-1] < 0xc0) {
      if (length < 2) goto LAB_002cea75;
      if (pbVar12[-2] < 0xe0) {
        if (((-0x41 < (char)pbVar12[-2]) || (length == 2)) || (pbVar12[-3] < 0xf0))
        goto LAB_002cea75;
        pbVar11 = pbVar12 + -3;
      }
      else {
        pbVar11 = pbVar12 + -2;
      }
    }
    else {
      pbVar11 = pbVar12 + -1;
    }
    if ((int)this->containsFFFD != uVar8) {
      pbVar12 = pbVar11;
    }
  }
LAB_002cea75:
  do {
    if (pbVar11 <= s) {
      return pbVar12;
    }
    bVar6 = *s;
    pbVar10 = s;
    if (-1 < (char)bVar6) {
      pbVar10 = s + 1;
      if (spanCondition == USET_SPAN_NOT_CONTAINED) {
        do {
          if (this->latin1Contains[bVar6] != '\0') goto LAB_002cec43;
          if (pbVar10 == pbVar11) {
            return pbVar12;
          }
          bVar6 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (-1 < (char)bVar6);
      }
      else {
        do {
          if (this->latin1Contains[bVar6] == '\0') {
LAB_002cec43:
            return pbVar10 + -1;
          }
          if (pbVar10 == pbVar11) {
            return pbVar12;
          }
          bVar6 = *pbVar10;
          pbVar10 = pbVar10 + 1;
        } while (-1 < (char)bVar6);
      }
      pbVar10 = pbVar10 + -1;
    }
    s = pbVar10 + 1;
    if (bVar6 < 0xe0) {
      if ((0xbf < bVar6) && ((byte)((ulong)*s ^ 0x80) < 0x40)) {
        if ((((byte)(this->table7FF[(ulong)*s ^ 0x80] >> (bVar6 & 0x1f)) ^
             spanCondition != USET_SPAN_NOT_CONTAINED) & 1) != 0) {
          return pbVar10;
        }
        s = pbVar10 + 2;
        goto LAB_002cea75;
      }
LAB_002cebe0:
      cVar1 = this->containsFFFD;
    }
    else {
      uVar5 = (ulong)*s ^ 0x80;
      if (bVar6 < 0xf0) {
        if ((0x3f < (byte)uVar5) || (0x3f < (byte)(pbVar10[2] ^ 0x80))) goto LAB_002cebe0;
        uVar9 = this->bmpBlockBits[uVar5] >> (bVar6 & 0xf) & 0x10001;
        if (1 < uVar9) {
          uVar9 = bVar6 & 0xf;
          UVar2 = containsSlow(this,(int)uVar5 << 6 | uVar9 << 0xc | pbVar10[2] ^ 0x80,
                               this->list4kStarts[uVar9],this->list4kStarts[(ulong)uVar9 + 1]);
          uVar9 = (uint)UVar2;
        }
        if (uVar9 != uVar8) {
          return pbVar10;
        }
        s = pbVar10 + 3;
        goto LAB_002cea75;
      }
      if (((0x3f < (byte)uVar5) || (0x3f < (byte)(pbVar10[2] ^ 0x80))) ||
         (0x3f < (byte)(pbVar10[3] ^ 0x80))) goto LAB_002cebe0;
      iVar7 = (uint)bVar6 * 0x40000;
      iVar3 = (int)uVar5 * 0x1000;
      if (iVar7 + iVar3 + 0xfc3f0000U < 0x100000) {
        cVar1 = containsSlow(this,(pbVar10[2] ^ 0x80) << 6 | pbVar10[3] ^ 0x80 |
                                  iVar3 + iVar7 + 0xfc400000U,this->list4kStarts[0x10],
                             this->list4kStarts[0x11]);
      }
      else {
        cVar1 = this->containsFFFD;
      }
      s = pbVar10 + 4;
    }
    if ((int)cVar1 != uVar8) {
      return pbVar10;
    }
  } while( true );
}

Assistant:

const uint8_t *
BMPSet::spanUTF8(const uint8_t *s, int32_t length, USetSpanCondition spanCondition) const {
    const uint8_t *limit=s+length;
    uint8_t b=*s;
    if(U8_IS_SINGLE(b)) {
        // Initial all-ASCII span.
        if(spanCondition) {
            do {
                if(!latin1Contains[b] || ++s==limit) {
                    return s;
                }
                b=*s;
            } while(U8_IS_SINGLE(b));
        } else {
            do {
                if(latin1Contains[b] || ++s==limit) {
                    return s;
                }
                b=*s;
            } while(U8_IS_SINGLE(b));
        }
        length=(int32_t)(limit-s);
    }

    if(spanCondition!=USET_SPAN_NOT_CONTAINED) {
        spanCondition=USET_SPAN_CONTAINED;  // Pin to 0/1 values.
    }

    const uint8_t *limit0=limit;

    /*
     * Make sure that the last 1/2/3/4-byte sequence before limit is complete
     * or runs into a lead byte.
     * In the span loop compare s with limit only once
     * per multi-byte character.
     *
     * Give a trailing illegal sequence the same value as the result of contains(FFFD),
     * including it if that is part of the span, otherwise set limit0 to before
     * the truncated sequence.
     */
    b=*(limit-1);
    if((int8_t)b<0) {
        // b>=0x80: lead or trail byte
        if(b<0xc0) {
            // single trail byte, check for preceding 3- or 4-byte lead byte
            if(length>=2 && (b=*(limit-2))>=0xe0) {
                limit-=2;
                if(containsFFFD!=spanCondition) {
                    limit0=limit;
                }
            } else if(b<0xc0 && b>=0x80 && length>=3 && (b=*(limit-3))>=0xf0) {
                // 4-byte lead byte with only two trail bytes
                limit-=3;
                if(containsFFFD!=spanCondition) {
                    limit0=limit;
                }
            }
        } else {
            // lead byte with no trail bytes
            --limit;
            if(containsFFFD!=spanCondition) {
                limit0=limit;
            }
        }
    }

    uint8_t t1, t2, t3;

    while(s<limit) {
        b=*s;
        if(U8_IS_SINGLE(b)) {
            // ASCII
            if(spanCondition) {
                do {
                    if(!latin1Contains[b]) {
                        return s;
                    } else if(++s==limit) {
                        return limit0;
                    }
                    b=*s;
                } while(U8_IS_SINGLE(b));
            } else {
                do {
                    if(latin1Contains[b]) {
                        return s;
                    } else if(++s==limit) {
                        return limit0;
                    }
                    b=*s;
                } while(U8_IS_SINGLE(b));
            }
        }
        ++s;  // Advance past the lead byte.
        if(b>=0xe0) {
            if(b<0xf0) {
                if( /* handle U+0000..U+FFFF inline */
                    (t1=(uint8_t)(s[0]-0x80)) <= 0x3f &&
                    (t2=(uint8_t)(s[1]-0x80)) <= 0x3f
                ) {
                    b&=0xf;
                    uint32_t twoBits=(bmpBlockBits[t1]>>b)&0x10001;
                    if(twoBits<=1) {
                        // All 64 code points with this lead byte and middle trail byte
                        // are either in the set or not.
                        if(twoBits!=(uint32_t)spanCondition) {
                            return s-1;
                        }
                    } else {
                        // Look up the code point in its 4k block of code points.
                        UChar32 c=(b<<12)|(t1<<6)|t2;
                        if(containsSlow(c, list4kStarts[b], list4kStarts[b+1]) != spanCondition) {
                            return s-1;
                        }
                    }
                    s+=2;
                    continue;
                }
            } else if( /* handle U+10000..U+10FFFF inline */
                (t1=(uint8_t)(s[0]-0x80)) <= 0x3f &&
                (t2=(uint8_t)(s[1]-0x80)) <= 0x3f &&
                (t3=(uint8_t)(s[2]-0x80)) <= 0x3f
            ) {
                // Give an illegal sequence the same value as the result of contains(FFFD).
                UChar32 c=((UChar32)(b-0xf0)<<18)|((UChar32)t1<<12)|(t2<<6)|t3;
                if( (   (0x10000<=c && c<=0x10ffff) ?
                            containsSlow(c, list4kStarts[0x10], list4kStarts[0x11]) :
                            containsFFFD
                    ) != spanCondition
                ) {
                    return s-1;
                }
                s+=3;
                continue;
            }
        } else {
            if( /* handle U+0000..U+07FF inline */
                b>=0xc0 &&
                (t1=(uint8_t)(*s-0x80)) <= 0x3f
            ) {
                if((USetSpanCondition)((table7FF[t1]&((uint32_t)1<<(b&0x1f)))!=0) != spanCondition) {
                    return s-1;
                }
                ++s;
                continue;
            }
        }

        // Give an illegal sequence the same value as the result of contains(FFFD).
        // Handle each byte of an illegal sequence separately to simplify the code;
        // no need to optimize error handling.
        if(containsFFFD!=spanCondition) {
            return s-1;
        }
    }

    return limit0;
}